

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::createReaderMacroOpNode(Parser *this,Token *t,Node *applied_to)

{
  long in_RDX;
  Token *in_RDI;
  Node *n;
  CompilationContext *in_stack_ffffffffffffffc8;
  Node *in_stack_ffffffffffffffd0;
  Node *local_8;
  
  if (in_RDX == 0) {
    local_8 = (Node *)0x0;
  }
  else {
    local_8 = (Node *)operator_new(0x30);
    Node::Node(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDI);
    local_8->nodeType = PNT_READER_MACRO;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffd0,
               (value_type *)in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

Node * createReaderMacroOpNode(Token & t, Node * applied_to)
  {
    if (!applied_to)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_READER_MACRO;
    n->children.push_back(applied_to);
    return n;
  }